

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_mtree_no_separator.c
# Opt level: O1

void test_write_format_mtree_no_separator(void)

{
  wchar_t wVar1;
  int iVar2;
  mode_t mVar3;
  archive *paVar4;
  char *pcVar5;
  la_int64_t lVar6;
  size_t used;
  archive_entry *ae;
  size_t local_40;
  archive_entry *local_38;
  
  paVar4 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_no_separator.c"
                   ,L'*',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  wVar1 = archive_write_set_format_mtree(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_no_separator.c"
                      ,L'+',0,"ARCHIVE_OK",(long)wVar1,"archive_write_set_format_mtree(a)",paVar4);
  iVar2 = archive_write_open_memory(paVar4,buff,0xfff,&local_40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_no_separator.c"
                      ,L'-',0,"ARCHIVE_OK",(long)iVar2,
                      "archive_write_open_memory(a, buff, sizeof(buff)-1, &used)",paVar4);
  local_38 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_no_separator.c"
                   ,L'0',(uint)(local_38 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(local_38,".");
  archive_entry_set_mode(local_38,0x41ed);
  iVar2 = archive_write_header(paVar4,local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_no_separator.c"
                      ,L'3',0,"ARCHIVE_OK",(long)iVar2,"archive_write_header(a, ae)",paVar4);
  archive_entry_free(local_38);
  local_38 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_no_separator.c"
                   ,L'7',(uint)(local_38 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(local_38,"noseparator");
  archive_entry_set_size(local_38,0);
  archive_entry_set_mode(local_38,0x81a4);
  iVar2 = archive_write_header(paVar4,local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_no_separator.c"
                      ,L';',0,"ARCHIVE_OK",(long)iVar2,"archive_write_header(a, ae)",paVar4);
  archive_entry_free(local_38);
  local_38 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_no_separator.c"
                   ,L'?',(uint)(local_38 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(local_38,"./withseparator");
  archive_entry_set_size(local_38,0);
  archive_entry_set_mode(local_38,0x81a4);
  iVar2 = archive_write_header(paVar4,local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_no_separator.c"
                      ,L'C',0,"ARCHIVE_OK",(long)iVar2,"archive_write_header(a, ae)",paVar4);
  archive_entry_free(local_38);
  iVar2 = archive_write_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_no_separator.c"
                      ,L'F',0,"ARCHIVE_OK",(long)iVar2,"archive_write_close(a)",paVar4);
  iVar2 = archive_write_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_no_separator.c"
                      ,L'G',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
  paVar4 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_no_separator.c"
                   ,L'L',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar2 = archive_read_support_format_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_no_separator.c"
                      ,L'M',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_format_all(a)",paVar4);
  iVar2 = archive_read_support_filter_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_no_separator.c"
                      ,L'N',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_filter_all(a)",paVar4);
  iVar2 = archive_read_open_memory(paVar4,buff,local_40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_no_separator.c"
                      ,L'O',0,"ARCHIVE_OK",(long)iVar2,"archive_read_open_memory(a, buff, used)",
                      paVar4);
  iVar2 = archive_read_next_header(paVar4,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_no_separator.c"
                      ,L'R',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header(a, &ae)",paVar4);
  failure("The path should be just \".\"");
  pcVar5 = archive_entry_pathname(local_38);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_no_separator.c"
             ,L'T',pcVar5,"archive_entry_pathname(ae)",".","\".\"",(void *)0x0,L'\0');
  mVar3 = archive_entry_mode(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_no_separator.c"
                      ,L'U',(ulong)mVar3,"archive_entry_mode(ae)",0x41ed,"AE_IFDIR | 0755",
                      (void *)0x0);
  iVar2 = archive_read_next_header(paVar4,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_no_separator.c"
                      ,L'X',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header(a, &ae)",paVar4);
  failure("The path should have \"./\" prefix");
  pcVar5 = archive_entry_pathname(local_38);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_no_separator.c"
             ,L'Z',pcVar5,"archive_entry_pathname(ae)","./noseparator","\"./noseparator\"",
             (void *)0x0,L'\0');
  lVar6 = archive_entry_size(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_no_separator.c"
                      ,L'[',lVar6,"archive_entry_size(ae)",0,"0",(void *)0x0);
  mVar3 = archive_entry_mode(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_no_separator.c"
                      ,L'\\',(ulong)mVar3,"archive_entry_mode(ae)",0x81a4,"AE_IFREG | 0644",
                      (void *)0x0);
  iVar2 = archive_read_next_header(paVar4,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_no_separator.c"
                      ,L'_',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header(a, &ae)",paVar4);
  pcVar5 = archive_entry_pathname(local_38);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_no_separator.c"
             ,L'`',pcVar5,"archive_entry_pathname(ae)","./withseparator","\"./withseparator\"",
             (void *)0x0,L'\0');
  lVar6 = archive_entry_size(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_no_separator.c"
                      ,L'a',lVar6,"archive_entry_size(ae)",0,"0",(void *)0x0);
  mVar3 = archive_entry_mode(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_no_separator.c"
                      ,L'b',(ulong)mVar3,"archive_entry_mode(ae)",0x81a4,"AE_IFREG | 0644",
                      (void *)0x0);
  iVar2 = archive_read_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_no_separator.c"
                      ,L'd',0,"ARCHIVE_OK",(long)iVar2,"archive_read_close(a)",paVar4);
  iVar2 = archive_read_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_no_separator.c"
                      ,L'e',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_write_format_mtree_no_separator)
{
	struct archive_entry *ae;
	struct archive* a;
	size_t used;

	/* Create a mtree format archive. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_mtree(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, sizeof(buff)-1, &used));

	/* Write "." file.  */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, ".");
	archive_entry_set_mode(ae, AE_IFDIR | 0755);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);

	/* Write "noseparator" file.  */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "noseparator");
	archive_entry_set_size(ae, 0);
	archive_entry_set_mode(ae, AE_IFREG | 0644);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);

	/* Write "./withseparator" file.  */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "./withseparator");
	archive_entry_set_size(ae, 0);
	archive_entry_set_mode(ae, AE_IFREG | 0644);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);

	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
        assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/*
	 * Read the data and check it.
	 */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_memory(a, buff, used));

	/* Read "." file. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	failure("The path should be just \".\"");
	assertEqualString(archive_entry_pathname(ae), ".");
	assertEqualInt(archive_entry_mode(ae), AE_IFDIR | 0755);

	/* Read "./noseparator" file. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	failure("The path should have \"./\" prefix");
	assertEqualString(archive_entry_pathname(ae), "./noseparator");
	assertEqualInt(archive_entry_size(ae), 0);
	assertEqualInt(archive_entry_mode(ae), AE_IFREG | 0644);

	/* Read "./withseparator" file. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(archive_entry_pathname(ae), "./withseparator");
	assertEqualInt(archive_entry_size(ae), 0);
	assertEqualInt(archive_entry_mode(ae), AE_IFREG | 0644);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}